

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpack11.cpp
# Opt level: O0

void __thiscall msgpack11::MsgPack::MsgPack(MsgPack *this,array *values)

{
  vector<msgpack11::MsgPack,_std::allocator<msgpack11::MsgPack>_> local_28;
  array *values_local;
  MsgPack *this_local;
  
  local_28.super__Vector_base<msgpack11::MsgPack,_std::allocator<msgpack11::MsgPack>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)values;
  values_local = (array *)this;
  std::
  make_shared<msgpack11::MsgPackArray,std::vector<msgpack11::MsgPack,std::allocator<msgpack11::MsgPack>>const&>
            (&local_28);
  std::shared_ptr<msgpack11::MsgPackValue>::shared_ptr<msgpack11::MsgPackArray,void>
            (&this->m_ptr,(shared_ptr<msgpack11::MsgPackArray> *)&local_28);
  std::shared_ptr<msgpack11::MsgPackArray>::~shared_ptr
            ((shared_ptr<msgpack11::MsgPackArray> *)&local_28);
  return;
}

Assistant:

MsgPack::MsgPack(const MsgPack::array &values)     : m_ptr(make_shared<MsgPackArray>(values)) {}